

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmPageSettings::IsValid(ON_3dmPageSettings *this,ON_TextLog *text_log)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  double dVar21;
  
  dVar1 = this->m_width_mm;
  if ((((dVar1 != 0.0) || (NAN(dVar1))) || (this->m_height_mm != 0.0)) || (NAN(this->m_height_mm)))
  {
    bVar14 = ON_IsValid(dVar1);
    bVar20 = 0.0 < this->m_width_mm;
    if (text_log != (ON_TextLog *)0x0 && (!bVar20 || !bVar14)) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_width_mm = %g (should be > 0.0).\n");
    }
    bVar15 = ON_IsValid(this->m_height_mm);
    dVar1 = this->m_height_mm;
    bVar8 = 0.0 >= dVar1;
    if (text_log != (ON_TextLog *)0x0 && (bVar8 || !bVar15)) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_height_mm = %g (should be > 0.0).\n");
    }
    bVar16 = ON_IsValid(this->m_top_margin_mm);
    dVar2 = this->m_top_margin_mm;
    bVar9 = 0.0 > dVar2;
    if (text_log != (ON_TextLog *)0x0 && (bVar9 || !bVar16)) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_top_margin_mm = %g (should be >= 0.0).\n"
                       );
    }
    bVar17 = ON_IsValid(this->m_bottom_margin_mm);
    dVar3 = this->m_bottom_margin_mm;
    bVar10 = 0.0 > dVar3;
    if (text_log != (ON_TextLog *)0x0 && (bVar10 || !bVar17)) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_bottom_margin_mm = %g (should be >= 0.0).\n");
    }
    bVar18 = ON_IsValid(this->m_left_margin_mm);
    dVar4 = this->m_left_margin_mm;
    bVar11 = 0.0 > dVar4;
    if (text_log != (ON_TextLog *)0x0 && (bVar11 || !bVar18)) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_left_margin_mm = %g (should be >= 0.0).\n");
    }
    bVar19 = ON_IsValid(this->m_right_margin_mm);
    dVar21 = this->m_right_margin_mm;
    bVar7 = 0.0 <= dVar21;
    bVar12 = !bVar7;
    if (text_log != (ON_TextLog *)0x0 && (bVar12 || !bVar19)) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_right_margin_mm = %g (should be >= 0.0).\n");
      dVar21 = this->m_right_margin_mm;
    }
    bVar5 = dVar21 + this->m_left_margin_mm < this->m_width_mm;
    bVar13 = !bVar5;
    if (text_log != (ON_TextLog *)0x0 && bVar13) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_left_margin_mm+m_right_margin_mm = %g > %g = m_width_mm.\n"
                       );
    }
    bVar6 = this->m_top_margin_mm + this->m_bottom_margin_mm < this->m_height_mm;
    if (text_log != (ON_TextLog *)0x0 && !bVar6) {
      ON_TextLog::Print(text_log,
                        "ON_3dmPageSettings has m_top_margin_mm+m_bottom_margin_mm = %g > %g = m_height_mm.\n"
                       );
      return false;
    }
    return bVar6 && ((text_log == (ON_TextLog *)0x0 || !bVar13) &&
                    (bVar5 && ((text_log == (ON_TextLog *)0x0 || !bVar12 && bVar19) &&
                              ((bVar7 && bVar19) &&
                              ((text_log == (ON_TextLog *)0x0 || (NAN(dVar4) || !bVar11) && bVar18)
                              && ((0.0 <= dVar4 && bVar18) &&
                                 ((text_log == (ON_TextLog *)0x0 ||
                                  (NAN(dVar3) || !bVar10) && bVar17) &&
                                 ((0.0 <= dVar3 && bVar17) &&
                                 ((text_log == (ON_TextLog *)0x0 || (NAN(dVar2) || !bVar9) && bVar16
                                  ) && ((0.0 <= dVar2 && bVar16) &&
                                       ((text_log == (ON_TextLog *)0x0 ||
                                        (NAN(dVar1) || !bVar8) && bVar15) &&
                                       ((0.0 < dVar1 && bVar15) && (bVar20 && bVar14)))))))))))));
  }
  dVar1 = this->m_top_margin_mm;
  if ((text_log != (ON_TextLog *)0x0) && ((dVar1 != 0.0 || (NAN(dVar1))))) {
    ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_top_margin_mm = %g (should be 0.0).\n",
                      dVar1);
  }
  if ((this->m_bottom_margin_mm != 0.0) || (NAN(this->m_bottom_margin_mm))) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_bottom_margin_mm = %g (should be 0.0).\n"
                       );
      if ((this->m_left_margin_mm != 0.0) || (NAN(this->m_left_margin_mm))) goto LAB_003a9c81;
    }
  }
  else {
    bVar20 = this->m_left_margin_mm == 0.0;
    if (text_log == (ON_TextLog *)0x0 || bVar20) {
      bVar20 = dVar1 == 0.0 && bVar20;
      goto LAB_003a9c94;
    }
LAB_003a9c81:
    ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_left_margin_mm = %g (should be 0.0).\n");
  }
  bVar20 = false;
LAB_003a9c94:
  bVar14 = this->m_right_margin_mm == 0.0;
  if (text_log != (ON_TextLog *)0x0 && !bVar14) {
    ON_TextLog::Print(text_log,"ON_3dmPageSettings has m_right_margin_mm = %g (should be 0.0).\n");
    return false;
  }
  return (bool)(bVar20 & bVar14);
}

Assistant:

bool ON_3dmPageSettings::IsValid( ON_TextLog* text_log ) const
{
  bool rc = true;

  if ( m_width_mm != 0.0 || m_height_mm != 0.0 )
  {
    if ( !ON_IsValid(m_width_mm) || m_width_mm <= 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_width_mm = %g (should be > 0.0).\n",m_width_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_height_mm) || m_height_mm <= 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_height_mm = %g (should be > 0.0).\n",m_height_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_top_margin_mm) || m_top_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm = %g (should be >= 0.0).\n",m_top_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_bottom_margin_mm) || m_bottom_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_bottom_margin_mm = %g (should be >= 0.0).\n",m_bottom_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_left_margin_mm) || m_left_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm = %g (should be >= 0.0).\n",m_left_margin_mm);
      }
      rc = false;
    }
    if ( !ON_IsValid(m_right_margin_mm) || m_right_margin_mm < 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_right_margin_mm = %g (should be >= 0.0).\n",m_right_margin_mm);
      }
      rc = false;
    }
    if ( m_left_margin_mm + m_right_margin_mm >= m_width_mm )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm+m_right_margin_mm = %g > %g = m_width_mm.\n",m_left_margin_mm + m_right_margin_mm, m_width_mm);
      }
      rc = false;
    }
    if ( m_top_margin_mm + m_bottom_margin_mm >= m_height_mm )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm+m_bottom_margin_mm = %g > %g = m_height_mm.\n",m_top_margin_mm + m_bottom_margin_mm, m_height_mm);
      }
      rc = false;
    }
  }
  else
  {
    if ( m_top_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_top_margin_mm = %g (should be 0.0).\n",m_top_margin_mm);
      }
      rc = false;
    }
    if ( m_bottom_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_bottom_margin_mm = %g (should be 0.0).\n",m_bottom_margin_mm);
      }
      rc = false;
    }
    if ( m_left_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_left_margin_mm = %g (should be 0.0).\n",m_left_margin_mm);
      }
      rc = false;
    }
    if ( m_right_margin_mm != 0.0 )
    {
      if ( text_log )
      {
        text_log->Print("ON_3dmPageSettings has m_right_margin_mm = %g (should be 0.0).\n",m_right_margin_mm);
      }
      rc = false;
    }
  }

  return rc;
}